

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GIC.h
# Opt level: O2

void __thiscall
Gudhi::cover_complex::Cover_complex<std::vector<float,_std::allocator<float>_>_>::
set_graph_from_file(Cover_complex<std::vector<float,_std::allocator<float>_>_> *this,
                   string *graph_file_name)

{
  pointer puVar1;
  istream *piVar2;
  long *plVar3;
  subgraph<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::property<boost::edge_index_t,_int,_boost::property<boost::edge_weight_t,_double,_boost::no_property>_>,_boost::no_property,_boost::listS>_>
  *in_R8;
  int source;
  int neighb;
  string line;
  pair<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_bool> local_3e0;
  ifstream input;
  stringstream stream;
  
  remove_edges(this,&this->one_skeleton);
  std::ifstream::ifstream(&input,(string *)graph_file_name,_S_in);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&input,(string *)&line);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
    std::__cxx11::stringstream::stringstream((stringstream *)&stream,(string *)&line,_S_out|_S_in);
    std::istream::operator>>((istream *)&stream,&source);
    while( true ) {
      plVar3 = (long *)std::istream::operator>>((istream *)&stream,&neighb);
      if ((*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) != 0) break;
      puVar1 = (this->vertices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      boost::
      add_edge<boost::adjacency_list<boost::setS,boost::vecS,boost::undirectedS,boost::no_property,boost::property<boost::edge_index_t,int,boost::property<boost::edge_weight_t,double,boost::no_property>>,boost::no_property,boost::listS>>
                (&local_3e0,(boost *)puVar1[source],puVar1[neighb],
                 (vertex_descriptor)&this->one_skeleton,in_R8);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  }
  std::__cxx11::string::~string((string *)&line);
  std::ifstream::~ifstream(&input);
  return;
}

Assistant:

void set_graph_from_file(const std::string& graph_file_name) {
    remove_edges(one_skeleton);
    int neighb;
    std::ifstream input(graph_file_name);
    std::string line;
    int source;
    while (std::getline(input, line)) {
      std::stringstream stream(line);
      stream >> source;
      while (stream >> neighb) boost::add_edge(vertices[source], vertices[neighb], one_skeleton);
    }
  }